

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

string * __thiscall
Catch::TagAliasRegistry::expandAliases
          (string *__return_storage_ptr__,TagAliasRegistry *this,string *unexpandedTestSpec)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  size_type __n;
  _Base_ptr p_Var3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  undefined8 uVar6;
  _Rb_tree_header *p_Var7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_98 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_98;
  pcVar2 = (unexpandedTestSpec->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + unexpandedTestSpec->_M_string_length);
  p_Var3 = (this->m_registry)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var7 = &(this->m_registry)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var7) {
    paVar1 = &local_b8.field_2;
    do {
      __n = clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find(__return_storage_ptr__,*(char **)(p_Var3 + 1),0,(size_type)p_Var3[1]._M_parent);
      if (__n != 0xffffffffffffffff) {
        clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        substr(&local_50,__return_storage_ptr__,0,__n);
        pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_50,*(char **)(p_Var3 + 2),(size_type)p_Var3[2]._M_parent);
        local_b8._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
        paVar5 = &pbVar4->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p == paVar5) {
          local_b8.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
          local_b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
          local_b8._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_b8.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
        }
        local_b8._M_string_length = pbVar4->_M_string_length;
        (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
        pbVar4->_M_string_length = 0;
        (pbVar4->field_2)._M_local_buf[0] = '\0';
        clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        substr(&local_90,__return_storage_ptr__,(long)&(p_Var3[1]._M_parent)->_M_color + __n,
               0xffffffffffffffff);
        uVar6 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != paVar1) {
          uVar6 = local_b8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar6 < local_90._M_string_length + local_b8._M_string_length) {
          uVar6 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            uVar6 = local_90.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar6 < local_90._M_string_length + local_b8._M_string_length)
          goto LAB_0012fd28;
          pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_90,0,0,local_b8._M_dataplus._M_p,local_b8._M_string_length);
        }
        else {
LAB_0012fd28:
          pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   _M_append(&local_b8,local_90._M_dataplus._M_p,local_90._M_string_length);
        }
        local_70._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
        paVar5 = &pbVar4->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p == paVar5) {
          local_70.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
          local_70.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        }
        else {
          local_70.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
        }
        local_70._M_string_length = pbVar4->_M_string_length;
        (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
        pbVar4->_M_string_length = 0;
        paVar5->_M_local_buf[0] = '\0';
        clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=(__return_storage_ptr__,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != paVar1) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var7);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TagAliasRegistry::expandAliases( std::string const& unexpandedTestSpec ) const {
        std::string expandedTestSpec = unexpandedTestSpec;
        for( auto const& registryKvp : m_registry ) {
            std::size_t pos = expandedTestSpec.find( registryKvp.first );
            if( pos != std::string::npos ) {
                expandedTestSpec =  expandedTestSpec.substr( 0, pos ) +
                                    registryKvp.second.tag +
                                    expandedTestSpec.substr( pos + registryKvp.first.size() );
            }
        }
        return expandedTestSpec;
    }